

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncAwait.h
# Opt level: O2

pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
async_simple::coro::
syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,std::__cxx11::string>>>
          (pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,coro *this,
          Lazy<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lazy)

{
  byte bVar1;
  pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  Condition cond;
  Try<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value;
  counting_semaphore<1L> local_5c;
  _Variant_storage<false,_std::monostate,_std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__exception_ptr::exception_ptr>
  local_58;
  type_conflict5 local_20;
  
  if (*(long **)(*(long *)this + 0x18) != (long *)0x0) {
    bVar1 = (**(code **)(**(long **)(*(long *)this + 0x18) + 0x18))();
    logicAssert((bool)(bVar1 ^ 1),"do not sync await in the same executor with Lazy");
  }
  local_20.cond = (Condition *)&local_5c;
  local_5c._M_sem._M_counter = (__semaphore_impl)0;
  local_20.value =
       (Try<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&local_58;
  local_58._M_index = '\0';
  detail::
  LazyBase<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ::
  start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_async_simple_coro_SyncAwait_h:44:16)>
            ((LazyBase<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              *)this,&local_20);
  std::counting_semaphore<1L>::acquire(&local_5c);
  ppVar2 = Try<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::value((Try<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_58);
  std::
  pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair(__return_storage_ptr__,ppVar2);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__exception_ptr::exception_ptr>
  ::~_Variant_storage(&local_58);
  return __return_storage_ptr__;
}

Assistant:

inline auto syncAwait(LazyType &&lazy) {
    auto executor = lazy.getExecutor();
    if (executor)
        logicAssert(!executor->currentThreadInExecutor(),
                    "do not sync await in the same executor with Lazy");

    util::Condition cond;
    using ValueType = typename std::decay_t<LazyType>::ValueType;

    Try<ValueType> value;
    std::move(std::forward<LazyType>(lazy))
        .start([&cond, &value](Try<ValueType> result) {
            value = std::move(result);
            cond.release();
        });
    cond.acquire();
    return std::move(value).value();
}